

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::load_next_row(jpeg_decoder *this)

{
  int iVar1;
  int iVar2;
  coeff_buf *pcVar3;
  coeff_buf *pcVar4;
  uint8 *puVar5;
  jpgd_block_t *pjVar6;
  jpgd_quant_t *pjVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int local_60;
  int block_x_mcu [4];
  
  block_x_mcu[0] = 0;
  block_x_mcu[1] = 0;
  block_x_mcu[2] = 0;
  block_x_mcu[3] = 0;
  iVar12 = 0;
  do {
    if (this->m_mcus_per_row <= iVar12) {
      iVar12 = this->m_comps_in_scan;
      if (iVar12 == 1) {
        this->m_block_y_mcu[this->m_comp_list[0]] = this->m_block_y_mcu[this->m_comp_list[0]] + 1;
      }
      else {
        for (lVar15 = 0; lVar15 < iVar12; lVar15 = lVar15 + 1) {
          this->m_block_y_mcu[this->m_comp_list[lVar15]] =
               this->m_block_y_mcu[this->m_comp_list[lVar15]] +
               this->m_comp_v_samp[this->m_comp_list[lVar15]];
          iVar12 = this->m_comps_in_scan;
        }
      }
      return;
    }
    iVar10 = 0;
    local_60 = 0;
    for (lVar15 = 0; lVar15 < this->m_blocks_per_mcu; lVar15 = lVar15 + 1) {
      iVar1 = this->m_mcu_org[lVar15];
      pcVar3 = this->m_dc_coeffs[iVar1];
      pcVar4 = this->m_ac_coeffs[iVar1];
      iVar9 = block_x_mcu[iVar1];
      iVar13 = this->m_block_y_mcu[iVar1] + local_60;
      iVar14 = pcVar4->block_size;
      puVar5 = pcVar4->pData;
      iVar2 = pcVar4->block_num_x;
      pjVar6 = this->m_pMCU_coefficients;
      pjVar7 = this->m_quant[this->m_comp_quant[iVar1]];
      pjVar6[lVar15 * 0x40] =
           *(jpgd_block_t *)
            (pcVar3->pData +
            (long)(iVar13 * pcVar3->block_size * pcVar3->block_num_x) +
            (long)((iVar10 + iVar9) * pcVar3->block_size));
      memcpy(pjVar6 + lVar15 * 0x40 + 1,
             puVar5 + (long)(iVar14 * iVar13 * iVar2) + 2 + (long)(iVar14 * (iVar10 + iVar9)),0x7e);
      uVar8 = 0x3f;
      do {
        uVar11 = uVar8;
        iVar14 = (int)uVar11;
        if (iVar14 == 0) break;
        uVar8 = (ulong)(iVar14 - 1);
      } while (pjVar6[lVar15 * 0x40 + (long)*(int *)(g_ZAG + uVar11 * 4)] == 0);
      this->m_mcu_block_max_zag[lVar15] = iVar14 + 1;
      for (; -1 < (int)uVar11; uVar11 = (ulong)((int)uVar11 - 1)) {
        if (pjVar6[lVar15 * 0x40 + (long)*(int *)(g_ZAG + uVar11 * 4)] != 0) {
          pjVar6[lVar15 * 0x40 + (long)*(int *)(g_ZAG + uVar11 * 4)] =
               pjVar6[lVar15 * 0x40 + (long)*(int *)(g_ZAG + uVar11 * 4)] * pjVar7[uVar11];
        }
      }
      if (this->m_comps_in_scan == 1) {
        iVar9 = iVar9 + 1;
LAB_0011a8b9:
        block_x_mcu[iVar1] = iVar9;
      }
      else {
        iVar14 = iVar10 + 1;
        iVar10 = iVar14;
        if (iVar14 == this->m_comp_h_samp[iVar1]) {
          local_60 = local_60 + 1;
          iVar10 = 0;
          if (local_60 == this->m_comp_v_samp[iVar1]) {
            iVar9 = iVar14 + iVar9;
            local_60 = 0;
            iVar10 = 0;
            goto LAB_0011a8b9;
          }
        }
      }
    }
    if (this->m_freq_domain_chroma_upsample == true) {
      transform_mcu_expand(this,iVar12);
    }
    else {
      transform_mcu(this,iVar12);
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

void jpeg_decoder::load_next_row() {
  int i;
  jpgd_block_t* p;
  jpgd_quant_t* q;
  int mcu_row, mcu_block = 0;
  int component_num, component_id;
  int block_x_mcu[JPGD_MAX_COMPONENTS];

  memset(block_x_mcu, 0, JPGD_MAX_COMPONENTS * sizeof(int));

  for (mcu_row = 0; mcu_row < m_mcus_per_row; mcu_row++) {
    int block_x_mcu_ofs = 0, block_y_mcu_ofs = 0;

    for (mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++) {
      component_id = m_mcu_org[mcu_block];
      q = m_quant[m_comp_quant[component_id]];

      p = m_pMCU_coefficients + 64 * mcu_block;

      jpgd_block_t* pAC = coeff_buf_getp(m_ac_coeffs[component_id], block_x_mcu[component_id] + block_x_mcu_ofs, m_block_y_mcu[component_id] + block_y_mcu_ofs);
      jpgd_block_t* pDC = coeff_buf_getp(m_dc_coeffs[component_id], block_x_mcu[component_id] + block_x_mcu_ofs, m_block_y_mcu[component_id] + block_y_mcu_ofs);
      p[0] = pDC[0];
      memcpy(&p[1], &pAC[1], 63 * sizeof(jpgd_block_t));

      for (i = 63; i > 0; i--)
        if (p[g_ZAG[i]])
          break;

      m_mcu_block_max_zag[mcu_block] = i + 1;

      for (; i >= 0; i--)
        if (p[g_ZAG[i]])
          p[g_ZAG[i]] = static_cast<jpgd_block_t>(p[g_ZAG[i]] * q[i]);

      if (m_comps_in_scan == 1)
        block_x_mcu[component_id]++;
      else {
        if (++block_x_mcu_ofs == m_comp_h_samp[component_id]) {
          block_x_mcu_ofs = 0;

          if (++block_y_mcu_ofs == m_comp_v_samp[component_id]) {
            block_y_mcu_ofs = 0;

            block_x_mcu[component_id] += m_comp_h_samp[component_id];
          }
        }
      }
    }

    if (m_freq_domain_chroma_upsample)
      transform_mcu_expand(mcu_row);
    else
      transform_mcu(mcu_row);
  }

  if (m_comps_in_scan == 1)
    m_block_y_mcu[m_comp_list[0]]++;
  else {
    for (component_num = 0; component_num < m_comps_in_scan; component_num++) {
      component_id = m_comp_list[component_num];

      m_block_y_mcu[component_id] += m_comp_v_samp[component_id];
    }
  }
}